

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GetNumBitsForMessage
          (ImmutableStringFieldLiteGenerator *this)

{
  bool bVar1;
  ImmutableStringFieldLiteGenerator *this_local;
  
  bVar1 = HasHasbit(this->descriptor_);
  return (uint)bVar1;
}

Assistant:

int ImmutableStringFieldLiteGenerator::GetNumBitsForMessage() const {
  return HasHasbit(descriptor_) ? 1 : 0;
}